

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall Analyser::analyse_scan_statement(Analyser *this)

{
  bool bVar1;
  TokenType TVar2;
  Token *pTVar3;
  Error *pEVar4;
  allocator<char> local_1d1;
  string local_1d0;
  optional<Token> local_1b0;
  undefined1 local_182;
  allocator<char> local_181;
  string local_180;
  optional<Token> local_160;
  Instruction local_134;
  Instruction local_124;
  undefined1 local_112;
  allocator<char> local_111;
  string local_110;
  undefined1 local_f0 [16];
  undefined1 local_e0 [8];
  string var;
  string local_b8;
  optional<Token> local_98;
  undefined1 local_6a;
  allocator<char> local_69;
  string local_68;
  undefined1 local_38 [8];
  optional<Token> next;
  Analyser *this_local;
  
  next.super__Optional_base<Token,_false,_false>._M_payload.
  super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>._32_8_ =
       this;
  nextToken((optional<Token> *)local_38,this);
  bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
  if (bVar1) {
    pTVar3 = std::optional<Token>::value((optional<Token> *)local_38);
    TVar2 = Token::GetType(pTVar3);
    if (TVar2 == LEFT_BRACKET) {
      nextToken(&local_98,this);
      std::optional<Token>::operator=((optional<Token> *)local_38,&local_98);
      std::optional<Token>::~optional(&local_98);
      bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
      if (bVar1) {
        pTVar3 = std::optional<Token>::value((optional<Token> *)local_38);
        TVar2 = Token::GetType(pTVar3);
        if (TVar2 == IDENTIFIER) {
          std::optional<Token>::value((optional<Token> *)local_38);
          Token::GetValue((Token *)local_f0);
          std::any_cast<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     (any *)local_f0);
          std::any::~any((any *)local_f0);
          bVar1 = loadVariable(this,(string *)local_e0);
          if (!bVar1) {
            local_112 = 1;
            pEVar4 = (Error *)__cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_110,"the variable is not declared",&local_111);
            Error::Error(pEVar4,&local_110,(long)this->_currentLine);
            local_112 = 0;
            __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
          }
          Instruction::Instruction(&local_124,iscan);
          addInstruction(this,&local_124);
          Instruction::Instruction(&local_134,istore);
          addInstruction(this,&local_134);
          nextToken(&local_160,this);
          std::optional<Token>::operator=((optional<Token> *)local_38,&local_160);
          std::optional<Token>::~optional(&local_160);
          bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
          if (bVar1) {
            pTVar3 = std::optional<Token>::value((optional<Token> *)local_38);
            TVar2 = Token::GetType(pTVar3);
            if (TVar2 == RIGHT_BRACKET) {
              nextToken(&local_1b0,this);
              std::optional<Token>::operator=((optional<Token> *)local_38,&local_1b0);
              std::optional<Token>::~optional(&local_1b0);
              bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
              if (bVar1) {
                pTVar3 = std::optional<Token>::value((optional<Token> *)local_38);
                TVar2 = Token::GetType(pTVar3);
                if (TVar2 == SEMICOLON) {
                  std::__cxx11::string::~string((string *)local_e0);
                  std::optional<Token>::~optional((optional<Token> *)local_38);
                  return;
                }
              }
              pEVar4 = (Error *)__cxa_allocate_exception(0x28);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1d0,"Missing \';\'",&local_1d1);
              Error::Error(pEVar4,&local_1d0,(long)this->_currentLine);
              __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
            }
          }
          local_182 = 1;
          pEVar4 = (Error *)__cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_180,"Missing \')\'",&local_181);
          Error::Error(pEVar4,&local_180,(long)this->_currentLine);
          local_182 = 0;
          __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
        }
      }
      var.field_2._M_local_buf[0xe] = '\x01';
      pEVar4 = (Error *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Missing identifier",
                 (allocator<char> *)(var.field_2._M_local_buf + 0xf));
      Error::Error(pEVar4,&local_b8,(long)this->_currentLine);
      var.field_2._M_local_buf[0xe] = '\0';
      __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
    }
  }
  local_6a = 1;
  pEVar4 = (Error *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Missing \'(\'",&local_69);
  Error::Error(pEVar4,&local_68,(long)this->_currentLine);
  local_6a = 0;
  __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
}

Assistant:

void Analyser::analyse_scan_statement()
{
	auto next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::LEFT_BRACKET) {
		throw Error("Missing '('", _currentLine);
	}
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::IDENTIFIER) {
		throw Error("Missing identifier", _currentLine);
	}
	std::string var = std::any_cast<std::string>(next.value().GetValue());
	if (!loadVariable(var)) {
		throw Error("the variable is not declared", _currentLine);
	}
	addInstruction(Instruction(Operation::iscan));
	addInstruction(Instruction(Operation::istore));
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::RIGHT_BRACKET) {
		throw Error("Missing ')'", _currentLine);
	}
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::SEMICOLON) {
		throw Error("Missing ';'", _currentLine);
	}
}